

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TArray<FLineSpecial_*,_FLineSpecial_*>::Resize
          (TArray<FLineSpecial_*,_FLineSpecial_*> *this,uint amount)

{
  uint uVar1;
  
  uVar1 = this->Count;
  if (amount < uVar1 || amount - uVar1 == 0) {
    if (amount != 0 && uVar1 == 0) {
      __assert_fail("last != ~0u",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                    ,0x1b2,
                    "void TArray<FLineSpecial *>::DoDelete(unsigned int, unsigned int) [T = FLineSpecial *, TT = FLineSpecial *]"
                   );
    }
  }
  else {
    Grow(this,amount - uVar1);
  }
  this->Count = amount;
  return;
}

Assistant:

void Resize (unsigned int amount)
	{
		if (Count < amount)
		{
			// Adding new entries
			Grow (amount - Count);
			for (unsigned int i = Count; i < amount; ++i)
			{
				::new((void *)&Array[i]) T;
			}
		}
		else if (Count != amount)
		{
			// Deleting old entries
			DoDelete (amount, Count - 1);
		}
		Count = amount;
	}